

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_0::FramebufferRenderCase::init
          (FramebufferRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *pNVar6;
  char *pcVar7;
  int iVar8;
  int local_1e4;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = *(int *)&(this->super_RenderCase).field_0x84;
  if (iVar3 == 7) {
    pcVar7 = "GL_EXT_color_buffer_float";
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_RenderCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_color_buffer_float");
    ctx = (EVP_PKEY_CTX *)pcVar7;
    if (!bVar2) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Color renderable float texture required.","");
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (iVar3 == 6) {
    ctx = (EVP_PKEY_CTX *)0xb7a479;
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_RenderCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_color_buffer_half_float");
    if (!bVar2) {
      pcVar7 = "GL_EXT_color_buffer_float";
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_RenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_color_buffer_float");
      ctx = (EVP_PKEY_CTX *)pcVar7;
      if (!bVar2) {
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Color renderable half float texture required.","");
        tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  RenderCase::init(&this->super_RenderCase,ctx);
  switch(*(undefined4 *)&(this->super_RenderCase).field_0x84) {
  case 0:
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Using default framebuffer.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    iVar3 = std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    return iVar3;
  case 1:
    local_1e4 = 0x8056;
    iVar3 = 0x1908;
    iVar8 = 0x8033;
    break;
  case 2:
    local_1e4 = 0x8057;
    iVar3 = 0x1908;
    iVar8 = 0x8034;
    break;
  case 3:
    local_1e4 = 0x8d62;
    iVar3 = 0x1907;
    iVar8 = 0x8363;
    break;
  case 4:
    local_1e4 = 0x8058;
    iVar3 = 0x1908;
    iVar8 = 0x1401;
    break;
  case 5:
    local_1e4 = 0x8059;
    iVar3 = 0x1908;
    iVar8 = 0x8368;
    break;
  case 6:
    local_1e4 = 0x881a;
    iVar3 = 0x1908;
    iVar8 = 0x140b;
    break;
  case 7:
    local_1e4 = 0x8814;
    iVar3 = 0x1908;
    iVar8 = 0x1406;
    break;
  default:
    iVar8 = 0;
    iVar3 = 0;
    local_1e4 = 0;
  }
  local_1b0._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating fbo. Texture internalFormat = ",0x27);
  local_1c0.m_getName = glu::getTextureFormatName;
  local_1c0.m_value = local_1e4;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", format = ",0xb);
  local_1d0.m_getName = glu::getTextureFormatName;
  local_1d0.m_value = iVar3;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", type = ",9);
  local_1e0.m_getName = glu::getTypeName;
  local_1e0.m_value = iVar8;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_texID);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texID);
  (**(code **)(lVar5 + 0x1310))(0xde1,0,local_1e4,0x100,0x100,0,iVar3,iVar8,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"texture init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x1ce);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fboID);
  (**(code **)(lVar5 + 0x78))(0x8d40,this->m_fboID);
  (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texID,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"fbo init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x1d4);
  iVar3 = (**(code **)(lVar5 + 0x170))(0x8d40);
  if (iVar3 == 0x8cd5) {
    return 0x8cd5;
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"could not create fbo for testing.","");
  tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FramebufferRenderCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// check requirements
	if (m_fboType == FBO_RGBA_FLOAT16)
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_half_float") &&
			!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float"))
			throw tcu::NotSupportedError("Color renderable half float texture required.");
	}
	else if (m_fboType == FBO_RGBA_FLOAT32)
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float"))
			throw tcu::NotSupportedError("Color renderable float texture required.");
	}

	// gen shader
	RenderCase::init();

	// create render target
	if (m_fboType == FBO_DEFAULT)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Using default framebuffer." << tcu::TestLog::EndMessage;
	}
	else
	{
		GLuint internalFormat	= 0;
		GLuint format			= 0;
		GLuint type				= 0;

		switch (m_fboType)
		{
			case FBO_RGBA4:			internalFormat = GL_RGBA4;		format = GL_RGBA;	type = GL_UNSIGNED_SHORT_4_4_4_4;		break;
			case FBO_RGB5_A1:		internalFormat = GL_RGB5_A1;	format = GL_RGBA;	type = GL_UNSIGNED_SHORT_5_5_5_1;		break;
			case FBO_RGB565:		internalFormat = GL_RGB565;		format = GL_RGB;	type = GL_UNSIGNED_SHORT_5_6_5;			break;
			case FBO_RGBA8:			internalFormat = GL_RGBA8;		format = GL_RGBA;	type = GL_UNSIGNED_BYTE;				break;
			case FBO_RGB10_A2:		internalFormat = GL_RGB10_A2;	format = GL_RGBA;	type = GL_UNSIGNED_INT_2_10_10_10_REV;	break;
			case FBO_RGBA_FLOAT16:	internalFormat = GL_RGBA16F;	format = GL_RGBA;	type = GL_HALF_FLOAT;					break;
			case FBO_RGBA_FLOAT32:	internalFormat = GL_RGBA32F;	format = GL_RGBA;	type = GL_FLOAT;						break;

			default:
				DE_ASSERT(false);
				break;
		}

		m_testCtx.getLog() << tcu::TestLog::Message
			<< "Creating fbo. Texture internalFormat = " << glu::getTextureFormatStr(internalFormat)
			<< ", format = " << glu::getTextureFormatStr(format)
			<< ", type = " << glu::getTypeStr(type)
			<< tcu::TestLog::EndMessage;

		// gen texture
		gl.genTextures(1, &m_texID);
		gl.bindTexture(GL_TEXTURE_2D, m_texID);
		gl.texImage2D(GL_TEXTURE_2D, 0, internalFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, 0, format, type, DE_NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texture init");

		// gen fbo
		gl.genFramebuffers(1, &m_fboID);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texID, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "fbo init");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::NotSupportedError("could not create fbo for testing.");
	}
}